

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall r_code::SysObject::SysObject(SysObject *this,Code *source)

{
  const_iterator cVar1;
  bool bVar2;
  ushort uVar3;
  uint32_t uVar4;
  Atom *a;
  Atom *this_00;
  SysView *this_01;
  reference ppVVar5;
  SysView **ppSVar6;
  _Node_iterator_base<r_code::View_*,_true> _Var7;
  _Node_iterator_base<r_code::View_*,_true> _Var8;
  _Node_iterator_base<r_code::View_*,_true> local_50;
  _Node_iterator_base<r_code::View_*,_true> local_48;
  _Node_iterator_base<r_code::View_*,_true> local_40;
  _Node_iterator_base<r_code::View_*,_true> local_38;
  const_iterator v;
  size_t i;
  Code *source_local;
  SysObject *this_local;
  
  ImageObject::ImageObject(&this->super_ImageObject);
  (this->super_ImageObject)._vptr_ImageObject = (_func_int **)&PTR__SysObject_0011bc60;
  vector<unsigned_int>::vector(&this->markers);
  vector<r_code::SysView_*>::vector(&this->views);
  v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
       (_Node_iterator_base<r_code::View_*,_true>)(__node_type *)0x0;
  while( true ) {
    cVar1.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
         v.super__Node_iterator_base<r_code::View_*,_true>._M_cur;
    uVar3 = (**(code **)(*(long *)source + 0x30))();
    _Var7._M_cur._2_6_ = 0;
    _Var7._M_cur._0_2_ = uVar3;
    if (_Var7._M_cur <= (ulong)cVar1.super__Node_iterator_base<r_code::View_*,_true>._M_cur) break;
    a = (Atom *)(**(code **)(*(long *)source + 0x20))
                          (source,(ulong)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur &
                                  0xffff);
    this_00 = vector<r_code::Atom>::operator[]
                        (&(this->super_ImageObject).code,
                         (size_t)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur);
    Atom::operator=(this_00,a);
    v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
         (_Node_iterator_base<r_code::View_*,_true>)
         ((long)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur + 1);
  }
  std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
            ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_38);
  (**(code **)(*(long *)source + 0x88))();
  v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
       (_Node_iterator_base<r_code::View_*,_true>)(__node_type *)0x0;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
       ::begin((unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
                *)(source + 0x58));
  std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
            ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_40,
             (_Node_iterator<r_code::View_*,_true,_true> *)&local_48);
  local_38._M_cur = local_40._M_cur;
  while( true ) {
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
         ::end((unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
                *)(source + 0x58));
    bVar2 = std::__detail::operator!=(&local_38,&local_50);
    if (!bVar2) break;
    this_01 = (SysView *)operator_new(0x38);
    ppVVar5 = std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator*
                        ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_38);
    SysView::SysView(this_01,*ppVVar5);
    ppSVar6 = vector<r_code::SysView_*>::operator[]
                        (&this->views,
                         (size_t)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur);
    *ppSVar6 = this_01;
    v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
         (_Node_iterator_base<r_code::View_*,_true>)
         ((long)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur + 1);
    std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator++
              ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_38);
  }
  (**(code **)(*(long *)source + 0x90))();
  uVar4 = (**(code **)(*(long *)source + 0x10))();
  this->oid = uVar4;
  v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
       (_Node_iterator_base<r_code::View_*,_true>)(__node_type *)0x0;
  while( true ) {
    cVar1.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
         v.super__Node_iterator_base<r_code::View_*,_true>._M_cur;
    uVar3 = (**(code **)(*(long *)source + 0x50))();
    _Var8._M_cur._2_6_ = 0;
    _Var8._M_cur._0_2_ = uVar3;
    if (_Var8._M_cur <= (ulong)cVar1.super__Node_iterator_base<r_code::View_*,_true>._M_cur) break;
    vector<unsigned_int>::push_back(&(this->super_ImageObject).references,0);
    v.super__Node_iterator_base<r_code::View_*,_true>._M_cur =
         (_Node_iterator_base<r_code::View_*,_true>)
         ((long)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur + 1);
  }
  return;
}

Assistant:

SysObject::SysObject(Code *source)
{
    size_t i;

    for (i = 0; i < source->code_size(); ++i) {
        code[i] = source->code(i);
    }

    std::unordered_set<View *, View::Hash, View::Equal>::const_iterator v;
    source->acq_views();

    for (i = 0, v = source->views.begin(); v != source->views.end(); ++i, ++v) {
        views[i] = new SysView(*v);
    }

    source->rel_views();
    oid = source->get_oid();

    for (i = 0; i < source->references_size(); ++i) { // to get the right size in Image::add_object().
        references.push_back(0);
    }
}